

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::eraseLast
          (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this)

{
  HistoryEntry *in_RDI;
  
  QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>::end
            ((QArrayDataPointer<QTextBrowserPrivate::HistoryEntry> *)in_RDI);
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry(in_RDI);
  (in_RDI->title).d.ptr = (char16_t *)((long)(in_RDI->title).d.ptr + -1);
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }